

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase107::run(TestCase107 *this)

{
  TestObject *pTVar1;
  char *in_R8;
  TestObject **in_R9;
  ArrayPtr<kj::(anonymous_namespace)::TestObject> AVar2;
  ArrayPtr<kj::(anonymous_namespace)::TestObject> AVar3;
  Arena arena;
  TestObject **in_stack_ffffffffffffff98;
  TestObject *local_58;
  TestObject *local_50;
  Arena local_48;
  
  (anonymous_namespace)::TestObject::count = 0;
  (anonymous_namespace)::TestObject::throwAt = 0xffffffff;
  Arena::Arena(&local_48,0x400);
  AVar2 = Arena::allocateArray<kj::(anonymous_namespace)::TestObject>(&local_48,4);
  pTVar1 = (TestObject *)AVar2.size_;
  AVar3 = Arena::allocateArray<kj::(anonymous_namespace)::TestObject>(&local_48,2);
  if (pTVar1 != (TestObject *)0x4 && _::Debug::minSeverity < 3) {
    in_R9 = &local_50;
    local_50 = (TestObject *)CONCAT44(local_50._4_4_,4);
    in_stack_ffffffffffffff98 = &local_58;
    in_R8 = "failed: expected (4u) == (arr1.size())";
    local_58 = pTVar1;
    _::Debug::log<char_const(&)[39],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0x73,ERROR,"\"failed: expected \" \"(4u) == (arr1.size())\", 4u, arr1.size()",
               (char (*) [39])"failed: expected (4u) == (arr1.size())",(uint *)in_R9,
               (unsigned_long *)in_stack_ffffffffffffff98);
  }
  if (_::Debug::minSeverity < 3 && (TestObject *)AVar3.size_ != (TestObject *)0x2) {
    in_R9 = &local_50;
    local_50 = (TestObject *)CONCAT44(local_50._4_4_,2);
    in_stack_ffffffffffffff98 = &local_58;
    in_R8 = "failed: expected (2u) == (arr2.size())";
    local_58 = (TestObject *)AVar3.size_;
    _::Debug::log<char_const(&)[39],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0x74,ERROR,"\"failed: expected \" \"(2u) == (arr2.size())\", 2u, arr2.size()",
               (char (*) [39])"failed: expected (2u) == (arr2.size())",(uint *)in_R9,
               (unsigned_long *)in_stack_ffffffffffffff98);
  }
  pTVar1 = AVar2.ptr + (long)pTVar1;
  if (_::Debug::minSeverity < 3 && AVar3.ptr < pTVar1) {
    local_58 = pTVar1;
    local_50 = AVar3.ptr;
    _::Debug::
    log<char_const(&)[48],kj::(anonymous_namespace)::TestObject*,kj::(anonymous_namespace)::TestObject*>
              ((char *)0x75,(int)&local_58,(LogSeverity)&local_50,(char *)pTVar1,
               (char (*) [48])in_R8,in_R9,in_stack_ffffffffffffff98);
  }
  if (((anonymous_namespace)::TestObject::count != 6) && (_::Debug::minSeverity < 3)) {
    local_58 = (TestObject *)CONCAT44(local_58._4_4_,6);
    _::Debug::log<char_const(&)[44],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0x76,ERROR,
               "\"failed: expected \" \"(6) == (TestObject::count)\", 6, TestObject::count",
               (char (*) [44])"failed: expected (6) == (TestObject::count)",(int *)&local_58,
               &(anonymous_namespace)::TestObject::count);
  }
  Arena::~Arena(&local_48);
  if (((anonymous_namespace)::TestObject::count != 0) && (_::Debug::minSeverity < 3)) {
    local_48.nextChunkSize._0_4_ = 0;
    _::Debug::log<char_const(&)[44],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0x79,ERROR,
               "\"failed: expected \" \"(0) == (TestObject::count)\", 0, TestObject::count",
               (char (*) [44])"failed: expected (0) == (TestObject::count)",(int *)&local_48,
               &(anonymous_namespace)::TestObject::count);
  }
  return;
}

Assistant:

TEST(AsyncIo, AddressParsing) {
  auto ioContext = setupAsyncIo();
  auto& w = ioContext.waitScope;
  auto& network = ioContext.provider->getNetwork();

  EXPECT_EQ("*:0", tryParse(w, network, "*"));
  EXPECT_EQ("*:123", tryParse(w, network, "*:123"));
  EXPECT_EQ("0.0.0.0:0", tryParse(w, network, "0.0.0.0"));
  EXPECT_EQ("1.2.3.4:5678", tryParse(w, network, "1.2.3.4", 5678));

#if !_WIN32
  EXPECT_EQ("unix:foo/bar/baz", tryParse(w, network, "unix:foo/bar/baz"));
  EXPECT_EQ("unix-abstract:foo/bar/baz", tryParse(w, network, "unix-abstract:foo/bar/baz"));
#endif

  // We can parse services by name...
  //
  // For some reason, Android and some various Linux distros do not support service names.
  if (systemSupportsAddress("1.2.3.4", "http")) {
    EXPECT_EQ("1.2.3.4:80", tryParse(w, network, "1.2.3.4:http", 5678));
    EXPECT_EQ("*:80", tryParse(w, network, "*:http", 5678));
  } else {
    KJ_LOG(WARNING, "system does not support resolving service names on ipv4; skipping tests");
  }

  // IPv6 tests. Annoyingly, these don't work on machines that don't have IPv6 configured on any
  // interfaces.
  if (systemSupportsAddress("::")) {
    EXPECT_EQ("[::]:123", tryParse(w, network, "0::0", 123));
    EXPECT_EQ("[12ab:cd::34]:321", tryParse(w, network, "[12ab:cd:0::0:34]:321", 432));
    if (systemSupportsAddress("12ab:cd::34", "http")) {
      EXPECT_EQ("[::]:80", tryParse(w, network, "[::]:http", 5678));
      EXPECT_EQ("[12ab:cd::34]:80", tryParse(w, network, "[12ab:cd::34]:http", 5678));
    } else {
      KJ_LOG(WARNING, "system does not support resolving service names on ipv6; skipping tests");
    }
  } else {
    KJ_LOG(WARNING, "system does not support ipv6; skipping tests");
  }

  // It would be nice to test DNS lookup here but the test would not be very hermetic.  Even
  // localhost can map to different addresses depending on whether IPv6 is enabled.  We do
  // connect to "localhost" in a different test, though.
}